

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client_sample.c
# Opt level: O3

void OnOperationComplete(MQTT_CLIENT_HANDLE handle,MQTT_CLIENT_EVENT_RESULT actionResult,
                        void *msgInfo,void *callbackCtx)

{
  uint16_t uVar1;
  int iVar2;
  MQTT_MESSAGE_HANDLE msgHandle;
  undefined8 uVar3;
  char *__format;
  SUBSCRIBE_PAYLOAD subscribe [2];
  SUBSCRIBE_PAYLOAD local_38;
  char *local_28;
  undefined4 local_20;
  
  uVar1 = PACKET_ID_VALUE;
  switch(actionResult) {
  case MQTT_CLIENT_ON_CONNACK:
    puts("ConnAck function called\r");
    uVar1 = PACKET_ID_VALUE;
    local_38.subscribeTopic = "msgA";
    local_38.qosReturn = DELIVER_AT_MOST_ONCE;
    local_28 = "msgB";
    local_20 = 2;
    PACKET_ID_VALUE = PACKET_ID_VALUE + 1;
    iVar2 = mqtt_client_subscribe(handle,uVar1,&local_38,2);
    if (iVar2 == 0) {
      return;
    }
    __format = "%d: mqtt_client_subscribe failed\r\n";
    uVar3 = 0x4f;
    break;
  case MQTT_CLIENT_ON_PUBLISH_ACK:
  case MQTT_CLIENT_ON_PUBLISH_RECV:
  case MQTT_CLIENT_ON_PUBLISH_REL:
  case MQTT_CLIENT_ON_UNSUBSCRIBE_ACK:
  case MQTT_CLIENT_ON_PING_RESPONSE:
    return;
  case MQTT_CLIENT_ON_PUBLISH_COMP:
    mqtt_client_disconnect(handle,(ON_MQTT_DISCONNECTED_CALLBACK)0x0,(void *)0x0);
    return;
  case MQTT_CLIENT_ON_SUBSCRIBE_ACK:
    PACKET_ID_VALUE = PACKET_ID_VALUE + 1;
    msgHandle = mqttmessage_create(uVar1,"msgA",DELIVER_EXACTLY_ONCE,
                                   (uint8_t *)"This is the app msg A.",0x16);
    if (msgHandle != (MQTT_MESSAGE_HANDLE)0x0) {
      iVar2 = mqtt_client_publish(handle,msgHandle);
      if (iVar2 != 0) {
        printf("%d: mqtt_client_publish failed\r\n",0x60);
        g_continue = 1;
      }
      mqttmessage_destroy(msgHandle);
      return;
    }
    __format = "%d: mqttmessage_create failed\r\n";
    uVar3 = 0x59;
    break;
  case MQTT_CLIENT_ON_DISCONNECT:
    goto switchD_00103b43_caseD_9;
  default:
    printf("unexpected value received for enumeration (%d)\n");
    return;
  }
  printf(__format,uVar3);
switchD_00103b43_caseD_9:
  g_continue = 1;
  return;
}

Assistant:

static void OnOperationComplete(MQTT_CLIENT_HANDLE handle, MQTT_CLIENT_EVENT_RESULT actionResult, const void* msgInfo, void* callbackCtx)
{
    (void)msgInfo;
    (void)callbackCtx;
    switch (actionResult)
    {
        case MQTT_CLIENT_ON_CONNACK:
        {
            (void)printf("ConnAck function called\r\n");

            SUBSCRIBE_PAYLOAD subscribe[2];
            subscribe[0].subscribeTopic = TOPIC_NAME_A;
            subscribe[0].qosReturn = DELIVER_AT_MOST_ONCE;
            subscribe[1].subscribeTopic = TOPIC_NAME_B;
            subscribe[1].qosReturn = DELIVER_EXACTLY_ONCE;

            if (mqtt_client_subscribe(handle, PACKET_ID_VALUE++, subscribe, sizeof(subscribe) / sizeof(subscribe[0])) != 0)
            {
                (void)printf("%d: mqtt_client_subscribe failed\r\n", __LINE__);
                g_continue = false;
            }
            break;
        }
        case MQTT_CLIENT_ON_SUBSCRIBE_ACK:
        {
            MQTT_MESSAGE_HANDLE msg = mqttmessage_create(PACKET_ID_VALUE++, TOPIC_NAME_A, DELIVER_EXACTLY_ONCE, (const uint8_t*)APP_NAME_A, strlen(APP_NAME_A));
            if (msg == NULL)
            {
                (void)printf("%d: mqttmessage_create failed\r\n", __LINE__);
                g_continue = false;
            }
            else
            {
                if (mqtt_client_publish(handle, msg))
                {
                    (void)printf("%d: mqtt_client_publish failed\r\n", __LINE__);
                    g_continue = false;
                }
                mqttmessage_destroy(msg);
            }
            // Now send a message that will get
            break;
        }
        case MQTT_CLIENT_ON_PUBLISH_ACK:
        {
            break;
        }
        case MQTT_CLIENT_ON_PUBLISH_RECV:
        {
            break;
        }
        case MQTT_CLIENT_ON_PUBLISH_REL:
        {
            break;
        }
        case MQTT_CLIENT_ON_PUBLISH_COMP:
        {
            // Done so send disconnect
            mqtt_client_disconnect(handle, NULL, NULL);
            break;
        }
        case MQTT_CLIENT_ON_DISCONNECT:
            g_continue = false;
            break;
        case MQTT_CLIENT_ON_UNSUBSCRIBE_ACK:
        {
            break;
        }
        case MQTT_CLIENT_ON_PING_RESPONSE:
            break;
        default:
        {
            (void)printf("unexpected value received for enumeration (%d)\n", (int)actionResult);
        }
    }
}